

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fClippingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ColoredLineCase::ColoredLineCase
          (ColoredLineCase *this,Context *context,char *name,char *description,
          ColoredLineData *linesBegin,ColoredLineData *linesEnd,float lineWidth,
          WindowRectangle *viewport)

{
  float lineWidth_local;
  ColoredLineData *linesEnd_local;
  ColoredLineData *linesBegin_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ColoredLineCase *this_local;
  
  LineRenderTestCase::LineRenderTestCase
            (&this->super_LineRenderTestCase,context,name,description,linesBegin,linesEnd,lineWidth,
             viewport);
  (this->super_LineRenderTestCase).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__ColoredLineCase_0327ff58;
  return;
}

Assistant:

ColoredLineCase::ColoredLineCase (Context& context, const char* name, const char* description, const LineRenderTestCase::ColoredLineData* linesBegin, const LineRenderTestCase::ColoredLineData* linesEnd, float lineWidth, const rr::WindowRectangle& viewport)
	: LineRenderTestCase (context, name, description, linesBegin, linesEnd, lineWidth, viewport)
{
}